

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::truncSatToUI16(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  uint uVar2;
  float fVar3;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  long local_28;
  float local_1c;
  
  if ((this->type).id != 4) {
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x39e);
  }
  Literal((Literal *)&local_38.func,this);
  if (local_28 == 4) {
    local_40 = 2;
    local_50.i32 = local_38.i32;
    local_1c = (float)local_38.i32;
    if (NAN((float)local_38.i32)) {
      uVar2 = 0;
    }
    else {
      bVar1 = isInRangeI16TruncU(local_38.i32);
      if (bVar1) {
        fVar3 = truncf(local_1c);
        uVar2 = (int)fVar3 & 0xffff;
      }
      else {
        uVar2 = 0xffff;
        if (local_38.i32 < 0) {
          uVar2 = 0;
        }
      }
    }
    (__return_storage_ptr__->field_0).i32 = uVar2;
    (__return_storage_ptr__->type).id = 2;
    ~Literal((Literal *)&local_50.func);
    ~Literal((Literal *)&local_38.func);
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::f32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x162,"Literal wasm::Literal::castToI32()");
}

Assistant:

Literal Literal::truncSatToUI16() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint16_t, isInRangeI16TruncU>(
      Literal(*this).castToI32().geti32());
  }
  WASM_UNREACHABLE("invalid type");
}